

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O0

void createRandomTapes(randomTape_t *tapes,uint8_t *seeds,uint8_t *salt,size_t t,
                      picnic_instance_t *params)

{
  long in_R8;
  uint16_t i_arr [4];
  size_t i;
  size_t tapeSizeBytes;
  hash_context_x4 ctx;
  short in_stack_fffffffffffffc88;
  short in_stack_fffffffffffffc8a;
  short in_stack_fffffffffffffc8c;
  uint16_t in_stack_fffffffffffffc8e;
  hash_context_x4 *ctx_00;
  randomTape_t *in_stack_fffffffffffffca0;
  uint8_t *in_stack_fffffffffffffca8;
  hash_context_x4 *in_stack_fffffffffffffcb0;
  uint8_t *in_stack_fffffffffffffcb8;
  uint8_t *in_stack_fffffffffffffcc0;
  uint8_t *in_stack_fffffffffffffcc8;
  hash_context_x4 *in_stack_fffffffffffffcd0;
  
  allocateRandomTape(in_stack_fffffffffffffca0,
                     (picnic_instance_t *)(long)(int)((uint)*(byte *)(in_R8 + 9) << 1));
  for (ctx_00 = (hash_context_x4 *)0x0; ctx_00 < (hash_context_x4 *)(ulong)*(byte *)(in_R8 + 0xb);
      ctx_00 = (hash_context_x4 *)((ctx_00->sponge).state + 4)) {
    hash_init_x4(ctx_00,CONCAT26(in_stack_fffffffffffffc8e,
                                 CONCAT24(in_stack_fffffffffffffc8c,
                                          CONCAT22(in_stack_fffffffffffffc8a,
                                                   in_stack_fffffffffffffc88))));
    hash_update_x4_4(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                     in_stack_fffffffffffffcb8,(uint8_t *)in_stack_fffffffffffffcb0,
                     (size_t)in_stack_fffffffffffffca8);
    hash_update_x4_1(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                     (size_t)in_stack_fffffffffffffca0);
    hash_update_x4_uint16_le(ctx_00,in_stack_fffffffffffffc8e);
    in_stack_fffffffffffffc88 = (short)ctx_00;
    in_stack_fffffffffffffc8a = in_stack_fffffffffffffc88 + 1;
    in_stack_fffffffffffffc8c = in_stack_fffffffffffffc88 + 2;
    in_stack_fffffffffffffc8e = in_stack_fffffffffffffc88 + 3;
    hash_update_x4_uint16s_le
              (ctx_00,(uint16_t *)
                      CONCAT26(in_stack_fffffffffffffc8e,
                               CONCAT24(in_stack_fffffffffffffc8c,
                                        CONCAT22(in_stack_fffffffffffffc8a,in_stack_fffffffffffffc88
                                                ))));
    hash_final_x4((hash_context_x4 *)0x1406c3);
    hash_squeeze_x4_4(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                      in_stack_fffffffffffffcb8,(uint8_t *)in_stack_fffffffffffffcb0,
                      (size_t)in_stack_fffffffffffffca8);
  }
  return;
}

Assistant:

static void createRandomTapes(randomTape_t* tapes, uint8_t* seeds, uint8_t* salt, size_t t,
                              const picnic_instance_t* params) {
  hash_context_x4 ctx;

  size_t tapeSizeBytes = 2 * params->view_size;

  allocateRandomTape(tapes, params);
  assert(params->num_MPC_parties % 4 == 0);
  for (size_t i = 0; i < params->num_MPC_parties; i += 4) {
    hash_init_x4(&ctx, params->digest_size);

    hash_update_x4_4(&ctx, &seeds[i * params->seed_size], &seeds[(i + 1) * params->seed_size],
                     &seeds[(i + 2) * params->seed_size], &seeds[(i + 3) * params->seed_size],
                     params->seed_size);
    hash_update_x4_1(&ctx, salt, SALT_SIZE);
    hash_update_x4_uint16_le(&ctx, t);
    const uint16_t i_arr[4] = {i + 0, i + 1, i + 2, i + 3};
    hash_update_x4_uint16s_le(&ctx, i_arr);
    hash_final_x4(&ctx);

    hash_squeeze_x4_4(&ctx, tapes->tape[i], tapes->tape[i + 1], tapes->tape[i + 2],
                      tapes->tape[i + 3], tapeSizeBytes);
    hash_clear_x4(&ctx);
  }
}